

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDressMapIds(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  undefined4 local_5c;
  int Class;
  int i;
  Vec_Int_t *vClass2Num;
  Vec_Int_t *vClassC;
  Vec_Int_t *vCounts1;
  Vec_Int_t *vCounts0;
  Vec_Int_t *vId2Lit2;
  Vec_Int_t *vId2Lit1;
  Vec_Ptr_t *vRes;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  Aig_Man_t *pMiter_local;
  
  p = Vec_PtrAlloc(1000);
  Abc_NtkDressMapSetPolarity(pNtk1);
  Abc_NtkDressMapSetPolarity(pNtk2);
  p_00 = Abc_NtkDressMapClasses(pMiter,pNtk1);
  p_01 = Abc_NtkDressMapClasses(pMiter,pNtk2);
  iVar1 = Aig_ManObjNumMax(pMiter);
  p_02 = Vec_IntStart(iVar1);
  for (local_5c = 0; iVar1 = Vec_IntSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_00,local_5c);
    if (-1 < iVar1) {
      Vec_IntAddToEntry(p_02,iVar1,1);
    }
  }
  iVar1 = Aig_ManObjNumMax(pMiter);
  p_03 = Vec_IntStart(iVar1);
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if (-1 < iVar1) {
      Vec_IntAddToEntry(p_03,iVar1,1);
    }
  }
  pVVar3 = Vec_IntAlloc(100);
  for (local_5c = 0; iVar1 = Vec_IntSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_00,local_5c);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjDressMakeId(pNtk1,local_5c,0);
      Vec_IntPush(pVVar3,iVar1);
    }
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjDressMakeId(pNtk2,local_5c,1);
      Vec_IntPush(pVVar3,iVar1);
    }
  }
  Vec_PtrPush(p,pVVar3);
  pVVar3 = Vec_IntAlloc(0);
  iVar1 = Aig_ManObjNumMax(pMiter);
  Vec_IntFill(pVVar3,iVar1,-1);
  for (local_5c = 0; iVar1 = Vec_IntSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_00,local_5c);
    if (((0 < iVar1) && (iVar2 = Vec_IntEntry(p_02,iVar1), iVar2 != 0)) &&
       (iVar2 = Vec_IntEntry(p_03,iVar1), iVar2 != 0)) {
      pVVar4 = Abc_ObjDressClass(p,pVVar3,iVar1);
      iVar1 = Abc_ObjDressMakeId(pNtk1,local_5c,0);
      Vec_IntPush(pVVar4,iVar1);
    }
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(p_01), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_5c);
    if (((0 < iVar1) && (iVar2 = Vec_IntEntry(p_02,iVar1), iVar2 != 0)) &&
       (iVar2 = Vec_IntEntry(p_03,iVar1), iVar2 != 0)) {
      pVVar4 = Abc_ObjDressClass(p,pVVar3,iVar1);
      iVar1 = Abc_ObjDressMakeId(pNtk2,local_5c,1);
      Vec_IntPush(pVVar4,iVar1);
    }
  }
  Vec_IntFree(pVVar3);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkDressMapIds( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vRes;
    Vec_Int_t * vId2Lit1, * vId2Lit2, * vCounts0, * vCounts1, * vClassC, * vClass2Num;
    int i, Class;
    // start the classes
    vRes = Vec_PtrAlloc( 1000 );
    // set polarity of the nodes
    Abc_NtkDressMapSetPolarity( pNtk1 );
    Abc_NtkDressMapSetPolarity( pNtk2 );
    // create mapping of node IDs of pNtk1/pNtk2 into the IDs of equiv classes of pMiter
    vId2Lit1 = Abc_NtkDressMapClasses( pMiter, pNtk1 );
    vId2Lit2 = Abc_NtkDressMapClasses( pMiter, pNtk2 );
    // count the number of nodes in each equivalence class
    vCounts0 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts0, Class, 1 );
    vCounts1 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts1, Class, 1 );
    // get the costant class
    vClassC = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk2, i, 1) );
    Vec_PtrPush( vRes, vClassC );
    // map repr node IDs into class numbers
    vClass2Num = Vec_IntAlloc( 0 );
    Vec_IntFill( vClass2Num, Aig_ManObjNumMax(pMiter), -1 );
    // keep classes having at least one element from pNtk1 and one from pNtk2
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk2, i, 1) );
    // package them accordingly
    Vec_IntFree( vClass2Num );
    Vec_IntFree( vCounts0 );
    Vec_IntFree( vCounts1 );
    Vec_IntFree( vId2Lit1 );
    Vec_IntFree( vId2Lit2 );
    return vRes;
}